

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Scene *pSVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  byte bVar6;
  undefined1 auVar7 [32];
  ulong uVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  int iVar11;
  AABBNodeMB4D *node1;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  float fVar43;
  undefined1 auVar44 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar45 [64];
  undefined1 auVar49 [16];
  uint uVar51;
  uint uVar52;
  uint uVar53;
  undefined1 auVar50 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  RTCFilterFunctionNArguments local_1570;
  undefined1 local_1540 [32];
  undefined1 local_1510 [16];
  undefined1 local_1500 [16];
  undefined1 local_14f0 [16];
  undefined1 local_14e0 [16];
  undefined1 local_14d0 [16];
  undefined1 local_14b0 [16];
  float local_14a0 [4];
  undefined1 local_1490 [16];
  float local_1480 [4];
  undefined1 local_1470 [16];
  undefined1 local_1460 [16];
  undefined1 local_1450 [16];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  RTCHitN local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined4 local_12a0;
  undefined4 uStack_129c;
  undefined4 uStack_1298;
  undefined4 uStack_1294;
  undefined4 uStack_1290;
  undefined4 uStack_128c;
  undefined4 uStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  puVar19 = local_11f8;
  local_1200 = root.ptr;
  fVar43 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1340._4_4_ = fVar43;
  local_1340._0_4_ = fVar43;
  local_1340._8_4_ = fVar43;
  local_1340._12_4_ = fVar43;
  local_1340._16_4_ = fVar43;
  local_1340._20_4_ = fVar43;
  local_1340._24_4_ = fVar43;
  local_1340._28_4_ = fVar43;
  auVar33 = ZEXT3264(local_1340);
  fVar46 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1360._4_4_ = fVar46;
  local_1360._0_4_ = fVar46;
  local_1360._8_4_ = fVar46;
  local_1360._12_4_ = fVar46;
  local_1360._16_4_ = fVar46;
  local_1360._20_4_ = fVar46;
  local_1360._24_4_ = fVar46;
  local_1360._28_4_ = fVar46;
  auVar34 = ZEXT3264(local_1360);
  fVar47 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1380._4_4_ = fVar47;
  local_1380._0_4_ = fVar47;
  local_1380._8_4_ = fVar47;
  local_1380._12_4_ = fVar47;
  local_1380._16_4_ = fVar47;
  local_1380._20_4_ = fVar47;
  local_1380._24_4_ = fVar47;
  local_1380._28_4_ = fVar47;
  auVar38 = ZEXT3264(local_1380);
  fVar43 = fVar43 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar46 = fVar46 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar47 = fVar47 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar14 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_13a0._0_8_ = CONCAT44(fVar43,fVar43) ^ 0x8000000080000000;
  local_13a0._8_4_ = -fVar43;
  local_13a0._12_4_ = -fVar43;
  local_13a0._16_4_ = -fVar43;
  local_13a0._20_4_ = -fVar43;
  local_13a0._24_4_ = -fVar43;
  local_13a0._28_4_ = -fVar43;
  auVar42 = ZEXT3264(local_13a0);
  local_13c0._0_8_ = CONCAT44(fVar46,fVar46) ^ 0x8000000080000000;
  local_13c0._8_4_ = -fVar46;
  local_13c0._12_4_ = -fVar46;
  local_13c0._16_4_ = -fVar46;
  local_13c0._20_4_ = -fVar46;
  local_13c0._24_4_ = -fVar46;
  local_13c0._28_4_ = -fVar46;
  auVar45 = ZEXT3264(local_13c0);
  iVar11 = (tray->tnear).field_0.i[k];
  local_13e0._4_4_ = iVar11;
  local_13e0._0_4_ = iVar11;
  local_13e0._8_4_ = iVar11;
  local_13e0._12_4_ = iVar11;
  local_13e0._16_4_ = iVar11;
  local_13e0._20_4_ = iVar11;
  local_13e0._24_4_ = iVar11;
  local_13e0._28_4_ = iVar11;
  auVar50 = ZEXT3264(local_13e0);
  iVar11 = (tray->tfar).field_0.i[k];
  local_1400._4_4_ = iVar11;
  local_1400._0_4_ = iVar11;
  local_1400._8_4_ = iVar11;
  local_1400._12_4_ = iVar11;
  local_1400._16_4_ = iVar11;
  local_1400._20_4_ = iVar11;
  local_1400._24_4_ = iVar11;
  local_1400._28_4_ = iVar11;
  auVar55 = ZEXT3264(local_1400);
  local_1420._0_8_ = CONCAT44(fVar47,fVar47) ^ 0x8000000080000000;
  local_1420._8_4_ = -fVar47;
  local_1420._12_4_ = -fVar47;
  local_1420._16_4_ = -fVar47;
  local_1420._20_4_ = -fVar47;
  local_1420._24_4_ = -fVar47;
  local_1420._28_4_ = -fVar47;
  auVar58 = ZEXT3264(local_1420);
  iVar11 = 1 << ((uint)k & 0x1f);
  auVar27._4_4_ = iVar11;
  auVar27._0_4_ = iVar11;
  auVar27._8_4_ = iVar11;
  auVar27._12_4_ = iVar11;
  auVar27._16_4_ = iVar11;
  auVar27._20_4_ = iVar11;
  auVar27._24_4_ = iVar11;
  auVar27._28_4_ = iVar11;
  auVar7 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar27 = vpand_avx2(auVar27,auVar7);
  local_1440 = vpcmpeqd_avx2(auVar27,auVar7);
  bVar10 = true;
  do {
    uVar21 = puVar19[-1];
    puVar19 = puVar19 + -1;
    while ((uVar21 & 8) == 0) {
      uVar12 = uVar21 & 0xfffffffffffffff0;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar28._4_4_ = uVar1;
      auVar28._0_4_ = uVar1;
      auVar28._8_4_ = uVar1;
      auVar28._12_4_ = uVar1;
      auVar28._16_4_ = uVar1;
      auVar28._20_4_ = uVar1;
      auVar28._24_4_ = uVar1;
      auVar28._28_4_ = uVar1;
      auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + uVar20),auVar28,
                                *(undefined1 (*) [32])(uVar12 + 0x40 + uVar20));
      auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar33._0_32_,auVar42._0_32_);
      auVar25 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + uVar22),auVar28,
                                *(undefined1 (*) [32])(uVar12 + 0x40 + uVar22));
      auVar25 = vfmadd213ps_fma(ZEXT1632(auVar25),auVar34._0_32_,auVar45._0_32_);
      auVar27 = vpmaxsd_avx2(ZEXT1632(auVar24),ZEXT1632(auVar25));
      auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + uVar14),auVar28,
                                *(undefined1 (*) [32])(uVar12 + 0x40 + uVar14));
      auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar38._0_32_,auVar58._0_32_);
      auVar7 = vpmaxsd_avx2(ZEXT1632(auVar24),auVar50._0_32_);
      auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + (uVar20 ^ 0x20)),auVar28,
                                *(undefined1 (*) [32])(uVar12 + 0x40 + (uVar20 ^ 0x20)));
      auVar27 = vpmaxsd_avx2(auVar27,auVar7);
      auVar25 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + (uVar22 ^ 0x20)),auVar28,
                                *(undefined1 (*) [32])(uVar12 + 0x40 + (uVar22 ^ 0x20)));
      auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar33._0_32_,auVar42._0_32_);
      auVar25 = vfmadd213ps_fma(ZEXT1632(auVar25),auVar34._0_32_,auVar45._0_32_);
      auVar7 = vpminsd_avx2(ZEXT1632(auVar24),ZEXT1632(auVar25));
      auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + (uVar14 ^ 0x20)),auVar28,
                                *(undefined1 (*) [32])(uVar12 + 0x40 + (uVar14 ^ 0x20)));
      auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar38._0_32_,auVar58._0_32_);
      auVar31 = vpminsd_avx2(ZEXT1632(auVar24),auVar55._0_32_);
      auVar7 = vpminsd_avx2(auVar7,auVar31);
      auVar27 = vcmpps_avx(auVar27,auVar7,2);
      if (((uint)uVar21 & 7) == 6) {
        auVar7 = vcmpps_avx(*(undefined1 (*) [32])(uVar12 + 0x1c0),auVar28,2);
        auVar31 = vcmpps_avx(auVar28,*(undefined1 (*) [32])(uVar12 + 0x1e0),1);
        auVar7 = vandps_avx(auVar7,auVar31);
        auVar27 = vandps_avx(auVar7,auVar27);
        auVar24 = vpackssdw_avx(auVar27._0_16_,auVar27._16_16_);
      }
      else {
        auVar24 = vpackssdw_avx(auVar27._0_16_,auVar27._16_16_);
      }
      auVar24 = vpsllw_avx(auVar24,0xf);
      if ((((((((auVar24 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar24 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar24 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar24 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar24 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar24 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar24 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar24[0xf])
      goto joined_r0x00629bbe;
      auVar24 = vpacksswb_avx(auVar24,auVar24);
      bVar6 = SUB161(auVar24 >> 7,0) & 1 | (SUB161(auVar24 >> 0xf,0) & 1) << 1 |
              (SUB161(auVar24 >> 0x17,0) & 1) << 2 | (SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
              (SUB161(auVar24 >> 0x27,0) & 1) << 4 | (SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
              (SUB161(auVar24 >> 0x37,0) & 1) << 6 | SUB161(auVar24 >> 0x3f,0) << 7;
      lVar18 = 0;
      for (uVar21 = (ulong)bVar6; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
        lVar18 = lVar18 + 1;
      }
      uVar21 = *(ulong *)(uVar12 + lVar18 * 8);
      uVar17 = bVar6 - 1 & (uint)bVar6;
      uVar15 = (ulong)uVar17;
      if (uVar17 != 0) {
        *puVar19 = uVar21;
        lVar18 = 0;
        for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
          lVar18 = lVar18 + 1;
        }
        uVar17 = uVar17 - 1 & uVar17;
        uVar15 = (ulong)uVar17;
        bVar23 = uVar17 == 0;
        while( true ) {
          puVar19 = puVar19 + 1;
          uVar21 = *(ulong *)(uVar12 + lVar18 * 8);
          if (bVar23) break;
          *puVar19 = uVar21;
          lVar18 = 0;
          for (uVar21 = uVar15; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
            lVar18 = lVar18 + 1;
          }
          uVar15 = uVar15 - 1 & uVar15;
          bVar23 = uVar15 == 0;
        }
      }
    }
    uVar12 = (ulong)((uint)uVar21 & 0xf);
    if (uVar12 != 8) {
      uVar21 = uVar21 & 0xfffffffffffffff0;
      lVar18 = 0;
      do {
        lVar13 = lVar18 * 0x140;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar25._4_4_ = uVar1;
        auVar25._0_4_ = uVar1;
        auVar25._8_4_ = uVar1;
        auVar25._12_4_ = uVar1;
        auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x90 + lVar13),auVar25,
                                  *(undefined1 (*) [16])(uVar21 + lVar13));
        auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xa0 + lVar13),auVar25,
                                  *(undefined1 (*) [16])(uVar21 + 0x10 + lVar13));
        auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xb0 + lVar13),auVar25,
                                 *(undefined1 (*) [16])(uVar21 + 0x20 + lVar13));
        auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xc0 + lVar13),auVar25,
                                  *(undefined1 (*) [16])(uVar21 + 0x30 + lVar13));
        auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xd0 + lVar13),auVar25,
                                  *(undefined1 (*) [16])(uVar21 + 0x40 + lVar13));
        auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xe0 + lVar13),auVar25,
                                  *(undefined1 (*) [16])(uVar21 + 0x50 + lVar13));
        auVar57 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xf0 + lVar13),auVar25,
                                  *(undefined1 (*) [16])(uVar21 + 0x60 + lVar13));
        auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x100 + lVar13),auVar25,
                                  *(undefined1 (*) [16])(uVar21 + 0x70 + lVar13));
        auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x110 + lVar13),auVar25,
                                  *(undefined1 (*) [16])(uVar21 + 0x80 + lVar13));
        auVar25 = vsubps_avx(auVar41,auVar24);
        auVar24 = vsubps_avx(auVar30,auVar36);
        auVar36 = vsubps_avx(auVar9,auVar44);
        auVar44 = vsubps_avx(auVar57,auVar41);
        auVar57 = vsubps_avx(auVar32,auVar30);
        auVar32 = vsubps_avx(auVar26,auVar9);
        auVar26._0_4_ = auVar24._0_4_ * auVar32._0_4_;
        auVar26._4_4_ = auVar24._4_4_ * auVar32._4_4_;
        auVar26._8_4_ = auVar24._8_4_ * auVar32._8_4_;
        auVar26._12_4_ = auVar24._12_4_ * auVar32._12_4_;
        local_1470 = vfmsub231ps_fma(auVar26,auVar57,auVar36);
        auVar29._0_4_ = auVar36._0_4_ * auVar44._0_4_;
        auVar29._4_4_ = auVar36._4_4_ * auVar44._4_4_;
        auVar29._8_4_ = auVar36._8_4_ * auVar44._8_4_;
        auVar29._12_4_ = auVar36._12_4_ * auVar44._12_4_;
        local_1460 = vfmsub231ps_fma(auVar29,auVar32,auVar25);
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar39._4_4_ = uVar1;
        auVar39._0_4_ = uVar1;
        auVar39._8_4_ = uVar1;
        auVar39._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar61._4_4_ = uVar1;
        auVar61._0_4_ = uVar1;
        auVar61._8_4_ = uVar1;
        auVar61._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar64._4_4_ = uVar1;
        auVar64._0_4_ = uVar1;
        auVar64._8_4_ = uVar1;
        auVar64._12_4_ = uVar1;
        fVar43 = *(float *)(ray + k * 4 + 0x80);
        auVar56._4_4_ = fVar43;
        auVar56._0_4_ = fVar43;
        auVar56._8_4_ = fVar43;
        auVar56._12_4_ = fVar43;
        auVar41 = vsubps_avx(auVar41,auVar39);
        fVar46 = *(float *)(ray + k * 4 + 0xa0);
        auVar60._4_4_ = fVar46;
        auVar60._0_4_ = fVar46;
        auVar60._8_4_ = fVar46;
        auVar60._12_4_ = fVar46;
        auVar30 = vsubps_avx(auVar30,auVar61);
        fVar47 = *(float *)(ray + k * 4 + 0xc0);
        auVar62._4_4_ = fVar47;
        auVar62._0_4_ = fVar47;
        auVar62._8_4_ = fVar47;
        auVar62._12_4_ = fVar47;
        auVar9 = vsubps_avx(auVar9,auVar64);
        auVar35._0_4_ = fVar43 * auVar30._0_4_;
        auVar35._4_4_ = fVar43 * auVar30._4_4_;
        auVar35._8_4_ = fVar43 * auVar30._8_4_;
        auVar35._12_4_ = fVar43 * auVar30._12_4_;
        auVar26 = vfmsub231ps_fma(auVar35,auVar41,auVar60);
        auVar59._0_4_ = auVar32._0_4_ * auVar26._0_4_;
        auVar59._4_4_ = auVar32._4_4_ * auVar26._4_4_;
        auVar59._8_4_ = auVar32._8_4_ * auVar26._8_4_;
        auVar59._12_4_ = auVar32._12_4_ * auVar26._12_4_;
        auVar54._0_4_ = auVar36._0_4_ * auVar26._0_4_;
        auVar54._4_4_ = auVar36._4_4_ * auVar26._4_4_;
        auVar54._8_4_ = auVar36._8_4_ * auVar26._8_4_;
        auVar54._12_4_ = auVar36._12_4_ * auVar26._12_4_;
        auVar36._0_4_ = fVar47 * auVar41._0_4_;
        auVar36._4_4_ = fVar47 * auVar41._4_4_;
        auVar36._8_4_ = fVar47 * auVar41._8_4_;
        auVar36._12_4_ = fVar47 * auVar41._12_4_;
        auVar32 = vfmsub231ps_fma(auVar36,auVar9,auVar56);
        auVar36 = vfmadd231ps_fma(auVar59,auVar32,auVar57);
        auVar32 = vfmadd231ps_fma(auVar54,auVar24,auVar32);
        auVar37._0_4_ = auVar57._0_4_ * auVar25._0_4_;
        auVar37._4_4_ = auVar57._4_4_ * auVar25._4_4_;
        auVar37._8_4_ = auVar57._8_4_ * auVar25._8_4_;
        auVar37._12_4_ = auVar57._12_4_ * auVar25._12_4_;
        local_1450 = vfmsub231ps_fma(auVar37,auVar44,auVar24);
        auVar24._0_4_ = fVar46 * auVar9._0_4_;
        auVar24._4_4_ = fVar46 * auVar9._4_4_;
        auVar24._8_4_ = fVar46 * auVar9._8_4_;
        auVar24._12_4_ = fVar46 * auVar9._12_4_;
        auVar26 = vfmsub231ps_fma(auVar24,auVar30,auVar62);
        auVar63._0_4_ = fVar47 * local_1450._0_4_;
        auVar63._4_4_ = fVar47 * local_1450._4_4_;
        auVar63._8_4_ = fVar47 * local_1450._8_4_;
        auVar63._12_4_ = fVar47 * local_1450._12_4_;
        auVar24 = vfmadd231ps_fma(auVar63,local_1460,auVar60);
        auVar57 = vfmadd231ps_fma(auVar24,local_1470,auVar56);
        auVar49._8_4_ = 0x80000000;
        auVar49._0_8_ = 0x8000000080000000;
        auVar49._12_4_ = 0x80000000;
        auVar36 = vfmadd231ps_fma(auVar36,auVar26,auVar44);
        auVar24 = vandps_avx(auVar57,auVar49);
        uVar17 = auVar24._0_4_;
        local_1500._0_4_ = (float)(uVar17 ^ auVar36._0_4_);
        uVar51 = auVar24._4_4_;
        local_1500._4_4_ = (float)(uVar51 ^ auVar36._4_4_);
        uVar52 = auVar24._8_4_;
        local_1500._8_4_ = (float)(uVar52 ^ auVar36._8_4_);
        uVar53 = auVar24._12_4_;
        local_1500._12_4_ = (float)(uVar53 ^ auVar36._12_4_);
        auVar24 = vfmadd231ps_fma(auVar32,auVar25,auVar26);
        local_14f0._0_4_ = (float)(uVar17 ^ auVar24._0_4_);
        local_14f0._4_4_ = (float)(uVar51 ^ auVar24._4_4_);
        local_14f0._8_4_ = (float)(uVar52 ^ auVar24._8_4_);
        local_14f0._12_4_ = (float)(uVar53 ^ auVar24._12_4_);
        auVar36 = ZEXT416(0) << 0x20;
        auVar24 = vcmpps_avx(local_1500,auVar36,5);
        auVar25 = vcmpps_avx(local_14f0,auVar36,5);
        auVar24 = vandps_avx(auVar24,auVar25);
        auVar44._8_4_ = 0x7fffffff;
        auVar44._0_8_ = 0x7fffffff7fffffff;
        auVar44._12_4_ = 0x7fffffff;
        local_14d0 = vandps_avx(auVar57,auVar44);
        auVar25 = vcmpps_avx(auVar57,auVar36,4);
        auVar24 = vandps_avx(auVar24,auVar25);
        auVar57._0_4_ = local_1500._0_4_ + local_14f0._0_4_;
        auVar57._4_4_ = local_1500._4_4_ + local_14f0._4_4_;
        auVar57._8_4_ = local_1500._8_4_ + local_14f0._8_4_;
        auVar57._12_4_ = local_1500._12_4_ + local_14f0._12_4_;
        auVar25 = vcmpps_avx(auVar57,local_14d0,2);
        auVar36 = auVar25 & auVar24;
        if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar36[0xf] < '\0') {
          auVar24 = vandps_avx(auVar24,auVar25);
          auVar40._0_4_ = local_1450._0_4_ * auVar9._0_4_;
          auVar40._4_4_ = local_1450._4_4_ * auVar9._4_4_;
          auVar40._8_4_ = local_1450._8_4_ * auVar9._8_4_;
          auVar40._12_4_ = local_1450._12_4_ * auVar9._12_4_;
          auVar25 = vfmadd213ps_fma(auVar30,local_1460,auVar40);
          auVar25 = vfmadd213ps_fma(auVar41,local_1470,auVar25);
          local_14e0._0_4_ = (float)(uVar17 ^ auVar25._0_4_);
          local_14e0._4_4_ = (float)(uVar51 ^ auVar25._4_4_);
          local_14e0._8_4_ = (float)(uVar52 ^ auVar25._8_4_);
          local_14e0._12_4_ = (float)(uVar53 ^ auVar25._12_4_);
          fVar43 = *(float *)(ray + k * 4 + 0x60);
          auVar32._0_4_ = local_14d0._0_4_ * fVar43;
          auVar32._4_4_ = local_14d0._4_4_ * fVar43;
          auVar32._8_4_ = local_14d0._8_4_ * fVar43;
          auVar32._12_4_ = local_14d0._12_4_ * fVar43;
          auVar25 = vcmpps_avx(auVar32,local_14e0,1);
          fVar43 = *(float *)(ray + k * 4 + 0x100);
          auVar33 = ZEXT1664(CONCAT412(fVar43,CONCAT48(fVar43,CONCAT44(fVar43,fVar43))));
          auVar41._0_4_ = local_14d0._0_4_ * fVar43;
          auVar41._4_4_ = local_14d0._4_4_ * fVar43;
          auVar41._8_4_ = local_14d0._8_4_ * fVar43;
          auVar41._12_4_ = local_14d0._12_4_ * fVar43;
          auVar36 = vcmpps_avx(local_14e0,auVar41,2);
          auVar25 = vandps_avx(auVar25,auVar36);
          local_14b0 = vandps_avx(auVar24,auVar25);
          uVar17 = vmovmskps_avx(local_14b0);
          if (uVar17 != 0) {
            pSVar3 = context->scene;
            auVar24 = vrcpps_avx(local_14d0);
            auVar30._8_4_ = 0x3f800000;
            auVar30._0_8_ = 0x3f8000003f800000;
            auVar30._12_4_ = 0x3f800000;
            auVar25 = vfnmadd213ps_fma(local_14d0,auVar24,auVar30);
            auVar24 = vfmadd132ps_fma(auVar25,auVar24,auVar24);
            fVar43 = auVar24._0_4_;
            fVar46 = auVar24._4_4_;
            fVar47 = auVar24._8_4_;
            fVar48 = auVar24._12_4_;
            local_1480[0] = fVar43 * local_14e0._0_4_;
            local_1480[1] = fVar46 * local_14e0._4_4_;
            local_1480[2] = fVar47 * local_14e0._8_4_;
            local_1480[3] = fVar48 * local_14e0._12_4_;
            local_14a0[0] = fVar43 * local_1500._0_4_;
            local_14a0[1] = fVar46 * local_1500._4_4_;
            local_14a0[2] = fVar47 * local_1500._8_4_;
            local_14a0[3] = fVar48 * local_1500._12_4_;
            local_1490._0_4_ = fVar43 * local_14f0._0_4_;
            local_1490._4_4_ = fVar46 * local_14f0._4_4_;
            local_1490._8_4_ = fVar47 * local_14f0._8_4_;
            local_1490._12_4_ = fVar48 * local_14f0._12_4_;
            uVar15 = (ulong)(uVar17 & 0xff);
            do {
              local_1510 = auVar33._0_16_;
              uVar8 = 0;
              for (uVar16 = uVar15; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                uVar8 = uVar8 + 1;
              }
              uVar17 = *(uint *)(lVar13 + uVar21 + 0x120 + uVar8 * 4);
              pGVar4 = (pSVar3->geometries).items[uVar17].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00629be2:
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                  return bVar10;
                }
                uVar16 = (ulong)(uint)((int)uVar8 * 4);
                uVar1 = *(undefined4 *)((long)local_14a0 + uVar16);
                local_12c0._4_4_ = uVar1;
                local_12c0._0_4_ = uVar1;
                local_12c0._8_4_ = uVar1;
                local_12c0._12_4_ = uVar1;
                local_12c0._16_4_ = uVar1;
                local_12c0._20_4_ = uVar1;
                local_12c0._24_4_ = uVar1;
                local_12c0._28_4_ = uVar1;
                local_12a0 = *(undefined4 *)(local_1490 + uVar16);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)((long)local_1480 + uVar16);
                local_1570.context = context->user;
                uVar1 = *(undefined4 *)(lVar13 + uVar21 + 0x130 + uVar16);
                local_1280._4_4_ = uVar1;
                local_1280._0_4_ = uVar1;
                local_1280._8_4_ = uVar1;
                local_1280._12_4_ = uVar1;
                local_1280._16_4_ = uVar1;
                local_1280._20_4_ = uVar1;
                local_1280._24_4_ = uVar1;
                local_1280._28_4_ = uVar1;
                uVar1 = *(undefined4 *)(local_1470 + uVar16);
                uVar2 = *(undefined4 *)(local_1460 + uVar16);
                local_1300._4_4_ = uVar2;
                local_1300._0_4_ = uVar2;
                local_1300._8_4_ = uVar2;
                local_1300._12_4_ = uVar2;
                local_1300._16_4_ = uVar2;
                local_1300._20_4_ = uVar2;
                local_1300._24_4_ = uVar2;
                local_1300._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_1450 + uVar16);
                local_12e0._4_4_ = uVar2;
                local_12e0._0_4_ = uVar2;
                local_12e0._8_4_ = uVar2;
                local_12e0._12_4_ = uVar2;
                local_12e0._16_4_ = uVar2;
                local_12e0._20_4_ = uVar2;
                local_12e0._24_4_ = uVar2;
                local_12e0._28_4_ = uVar2;
                local_1260._4_4_ = uVar17;
                local_1260._0_4_ = uVar17;
                local_1260._8_4_ = uVar17;
                local_1260._12_4_ = uVar17;
                local_1260._16_4_ = uVar17;
                local_1260._20_4_ = uVar17;
                local_1260._24_4_ = uVar17;
                local_1260._28_4_ = uVar17;
                local_1320[0] = (RTCHitN)(char)uVar1;
                local_1320[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_1320[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_1320[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_1320[4] = (RTCHitN)(char)uVar1;
                local_1320[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_1320[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_1320[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_1320[8] = (RTCHitN)(char)uVar1;
                local_1320[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_1320[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_1320[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_1320[0xc] = (RTCHitN)(char)uVar1;
                local_1320[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_1320[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_1320[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_1320[0x10] = (RTCHitN)(char)uVar1;
                local_1320[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_1320[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_1320[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_1320[0x14] = (RTCHitN)(char)uVar1;
                local_1320[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_1320[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_1320[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_1320[0x18] = (RTCHitN)(char)uVar1;
                local_1320[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_1320[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_1320[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_1320[0x1c] = (RTCHitN)(char)uVar1;
                local_1320[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_1320[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_1320[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                uStack_129c = local_12a0;
                uStack_1298 = local_12a0;
                uStack_1294 = local_12a0;
                uStack_1290 = local_12a0;
                uStack_128c = local_12a0;
                uStack_1288 = local_12a0;
                uStack_1284 = local_12a0;
                vpcmpeqd_avx2(local_12c0,local_12c0);
                uStack_123c = (local_1570.context)->instID[0];
                local_1240 = uStack_123c;
                uStack_1238 = uStack_123c;
                uStack_1234 = uStack_123c;
                uStack_1230 = uStack_123c;
                uStack_122c = uStack_123c;
                uStack_1228 = uStack_123c;
                uStack_1224 = uStack_123c;
                uStack_121c = (local_1570.context)->instPrimID[0];
                local_1220 = uStack_121c;
                uStack_1218 = uStack_121c;
                uStack_1214 = uStack_121c;
                uStack_1210 = uStack_121c;
                uStack_120c = uStack_121c;
                uStack_1208 = uStack_121c;
                uStack_1204 = uStack_121c;
                local_1540 = local_1440;
                local_1570.valid = (int *)local_1540;
                local_1570.geometryUserPtr = pGVar4->userPtr;
                local_1570.hit = local_1320;
                local_1570.N = 8;
                local_1570.ray = (RTCRayN *)ray;
                if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar4->occlusionFilterN)(&local_1570);
                }
                auVar7 = vpcmpeqd_avx2(local_1540,_DAT_01faff00);
                auVar27 = _DAT_01fe9960 & ~auVar7;
                if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar27 >> 0x7f,0) == '\0') &&
                      (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar27 >> 0xbf,0) == '\0') &&
                    (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar27[0x1f]) {
                  auVar7 = auVar7 ^ _DAT_01fe9960;
                }
                else {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var5)(&local_1570);
                  }
                  auVar27 = vpcmpeqd_avx2(local_1540,_DAT_01faff00);
                  auVar7 = auVar27 ^ _DAT_01fe9960;
                  auVar31._8_4_ = 0xff800000;
                  auVar31._0_8_ = 0xff800000ff800000;
                  auVar31._12_4_ = 0xff800000;
                  auVar31._16_4_ = 0xff800000;
                  auVar31._20_4_ = 0xff800000;
                  auVar31._24_4_ = 0xff800000;
                  auVar31._28_4_ = 0xff800000;
                  auVar27 = vblendvps_avx(auVar31,*(undefined1 (*) [32])(local_1570.ray + 0x100),
                                          auVar27);
                  *(undefined1 (*) [32])(local_1570.ray + 0x100) = auVar27;
                }
                if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar7 >> 0x7f,0) != '\0') ||
                      (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar7 >> 0xbf,0) != '\0') ||
                    (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar7[0x1f] < '\0') goto LAB_00629be2;
                auVar33 = ZEXT1664(local_1510);
                *(int *)(ray + k * 4 + 0x100) = local_1510._0_4_;
              }
              uVar15 = uVar15 ^ 1L << (uVar8 & 0x3f);
            } while (uVar15 != 0);
          }
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != uVar12 - 8);
    }
    auVar33 = ZEXT3264(local_1340);
    auVar34 = ZEXT3264(local_1360);
    auVar38 = ZEXT3264(local_1380);
    auVar42 = ZEXT3264(local_13a0);
    auVar45 = ZEXT3264(local_13c0);
    auVar50 = ZEXT3264(local_13e0);
    auVar55 = ZEXT3264(local_1400);
    auVar58 = ZEXT3264(local_1420);
joined_r0x00629bbe:
    bVar10 = puVar19 != &local_1200;
    if (!bVar10) {
      return bVar10;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }